

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O2

void build_sorted_tables(ecs_query_t *query)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  int32_t start;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  
  ecs_vector_free(query->table_slices);
  query->table_slices = (ecs_vector_t *)0x0;
  uVar1 = ecs_vector_count(query->tables);
  pvVar3 = _ecs_vector_first(query->tables,0x50,0x10);
  uVar7 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar7;
  }
  piVar5 = (int *)((long)pvVar3 + 0x48);
  uVar4 = 0;
  iVar2 = 0;
  for (; start = (int32_t)uVar4, uVar6 != uVar7; uVar7 = uVar7 + 1) {
    if ((iVar2 != *piVar5) && (iVar2 = *piVar5, uVar7 != uVar4)) {
      build_sorted_table_range(query,start,(int32_t)uVar7);
      uVar4 = uVar7 & 0xffffffff;
      iVar2 = *piVar5;
    }
    piVar5 = piVar5 + 0x14;
  }
  if (start != (int)uVar6) {
    build_sorted_table_range(query,start,(int)uVar6);
    return;
  }
  return;
}

Assistant:

static
void build_sorted_tables(
    ecs_query_t *query)
{
    /* Clean previous sorted tables */
    ecs_vector_free(query->table_slices);
    query->table_slices = NULL;

    int32_t i, count = ecs_vector_count(query->tables);
    ecs_matched_table_t *tables = ecs_vector_first(query->tables, ecs_matched_table_t);
    ecs_matched_table_t *table = NULL;

    int32_t start = 0, rank = 0;
    for (i = 0; i < count; i ++) {
        table = &tables[i];
        if (rank != table->rank) {
            if (start != i) {
                build_sorted_table_range(query, start, i);
                start = i;
            }
            rank = table->rank;
        }
    }

    if (start != i) {
        build_sorted_table_range(query, start, i);
    }
}